

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqvm.cpp
# Opt level: O0

bool __thiscall SQVM::StringCat(SQVM *this,SQObjectPtr *str,SQObjectPtr *obj,SQObjectPtr *dest)

{
  undefined1 uVar1;
  undefined1 uVar2;
  SQVM *in_RCX;
  SQObjectPtr *in_RDI;
  SQInteger ol;
  SQInteger l;
  SQObjectPtr b;
  SQObjectPtr a;
  SQString *in_stack_ffffffffffffff80;
  undefined6 in_stack_ffffffffffffff88;
  SQObjectPtr local_48;
  SQObjectPtr *in_stack_ffffffffffffffc8;
  SQObjectValue in_stack_ffffffffffffffd0;
  bool local_1;
  
  ::SQObjectPtr::SQObjectPtr((SQObjectPtr *)&stack0xffffffffffffffc8);
  ::SQObjectPtr::SQObjectPtr(&local_48);
  uVar1 = ToString(in_RCX,(SQObjectPtr *)in_stack_ffffffffffffffd0.pTable,in_stack_ffffffffffffffc8)
  ;
  if ((bool)uVar1) {
    uVar2 = ToString(in_RCX,(SQObjectPtr *)in_stack_ffffffffffffffd0.pTable,
                     in_stack_ffffffffffffffc8);
    if ((bool)uVar2) {
      in_stack_ffffffffffffff80 =
           SQString::Concat(((in_stack_ffffffffffffffd0.pTable)->super_SQDelegable).
                            super_SQCollectable._sharedstate,
                            (SQChar *)
                            ((local_48.super_SQObject._unVal.pTable)->super_SQDelegable).
                            super_SQCollectable._sharedstate,(SQInteger)in_RDI,
                            (SQChar *)CONCAT17(uVar1,CONCAT16(uVar2,in_stack_ffffffffffffff88)),
                            (SQInteger)in_stack_ffffffffffffff80);
      ::SQObjectPtr::operator=
                (in_RDI,(SQString *)CONCAT17(uVar1,CONCAT16(uVar2,in_stack_ffffffffffffff88)));
      local_1 = true;
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_ffffffffffffff80);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_ffffffffffffff80);
  return local_1;
}

Assistant:

bool SQVM::StringCat(const SQObjectPtr &str,const SQObjectPtr &obj,SQObjectPtr &dest)
{
    SQObjectPtr a, b;
    if(!ToString(str, a)) return false;
    if(!ToString(obj, b)) return false;
    SQInteger l = _string(a)->_len , ol = _string(b)->_len;
#ifdef SQ_NO_FAST_STRINGCAT
    SQChar* s = _sp(sq_rsl(l + ol + 1));
    memcpy(s, _stringval(a), sq_rsl(l));
    memcpy(s + l, _stringval(b), sq_rsl(ol));
    dest = SQString::Create(_ss(this), _spval, l + ol);
#else
    dest = SQString::Concat(_ss(this),_stringval(a),l,_stringval(b),ol);
#endif
    return true;
}